

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O1

bool __thiscall
ObjectModelBuilder::buildReplicator(ObjectModelBuilder *this,object *object,Class *clazz)

{
  size_type *psVar1;
  string *this_00;
  _Rb_tree_color _Var2;
  element_type *peVar3;
  undefined8 uVar4;
  element_type *peVar5;
  const_iterator cVar6;
  ostream *poVar7;
  Class *clazz_00;
  bool bVar8;
  undefined1 local_1b8 [8];
  Replicator r;
  string parentName;
  undefined1 local_b0 [8];
  Value v;
  string className;
  string id;
  
  findStringInObject((string *)local_1b8,object,"id");
  uniqueIdentifier((string *)((long)&className.field_2 + 8),this,clazz_00,(string *)local_1b8);
  psVar1 = &r.id._M_string_length;
  if (local_1b8 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_1b8);
  }
  findStringInObject((string *)&v.type,object,"class");
  if (className._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: \'replciator\' missing \'class\' tag, id=",0x2c);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)className.field_2._8_8_,
                        (long)id._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    bVar8 = false;
    goto LAB_0010f6bf;
  }
  findStringInObject((string *)((long)&r.terminator.field_2 + 8),object,"parent");
  if (parentName._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: \'replciator\' missing \'parent\' tag, id=",0x2d);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)className.field_2._8_8_,
                        (long)id._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    bVar8 = false;
  }
  else {
    r.id.field_2._8_8_ = &r.clazz._M_string_length;
    r.id._M_dataplus._M_p = (pointer)0x0;
    r.id._M_string_length._0_1_ = 0;
    r.clazz._M_dataplus._M_p = (pointer)0x0;
    r.clazz._M_string_length._0_1_ = 0;
    r.clazz.field_2._8_8_ = &r.parentId._M_string_length;
    r.parentId._M_dataplus._M_p = (pointer)0x0;
    r.parentId._M_string_length._0_1_ = 0;
    r.parentId.field_2._8_8_ = &r.count.stringValue._M_string_length;
    r.count.stringValue._M_dataplus._M_p = (pointer)0x0;
    r.count.stringValue._M_string_length._0_1_ = 0;
    r.count.numberValue = 0.0;
    r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = 0;
    r.count._56_8_ = &r.initializor._M_string_length;
    r.initializor._M_dataplus._M_p = (pointer)0x0;
    r.initializor._M_string_length._0_1_ = 0;
    r.initializor.field_2._8_8_ = &r.terminator._M_string_length;
    r.terminator._M_dataplus._M_p = (pointer)0x0;
    r.terminator._M_string_length._0_1_ = 0;
    local_1b8 = (undefined1  [8])psVar1;
    parentName.field_2._8_8_ = clazz;
    std::__cxx11::string::_M_assign((string *)local_1b8);
    std::__cxx11::string::_M_assign((string *)(r.id.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign((string *)(r.clazz.field_2._M_local_buf + 8));
    psVar1 = &v.stringValue._M_string_length;
    local_b0 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"count","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::find(&object->_M_t,(key_type *)local_b0);
    if (local_b0 != (undefined1  [8])psVar1) {
      operator_delete((void *)local_b0);
    }
    this_00 = (string *)(r.parentId.field_2._M_local_buf + 8);
    if ((_Rb_tree_header *)cVar6._M_node == &(object->_M_t)._M_impl.super__Rb_tree_header) {
      v.stringValue._M_dataplus._M_p = (pointer)0x0;
      v.stringValue._M_string_length._0_1_ = 0;
      v.numberValue = 0.0;
      v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
      v.stringValue.field_2._8_8_ = 0;
      local_b0 = (undefined1  [8])psVar1;
      std::__cxx11::string::operator=(this_00,(string *)local_b0);
      peVar5 = v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      r.count.numberValue = v.numberValue;
      peVar3 = r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      r.count.stringValue.field_2._8_8_ = v.stringValue.field_2._8_8_;
      v.numberValue = 0.0;
      v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
      if (peVar3 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
      }
      r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_4_ = v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._0_4_;
      if (v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (local_b0 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_b0);
      }
LAB_0010f499:
      findStringInObject((string *)local_b0,object,"initializor");
      std::__cxx11::string::operator=((string *)&r.count.type,(string *)local_b0);
      if (local_b0 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_b0);
      }
      findStringInObject((string *)local_b0,object,"terminator");
      std::__cxx11::string::operator=
                ((string *)(r.initializor.field_2._M_local_buf + 8),(string *)local_b0);
      if (local_b0 != (undefined1  [8])psVar1) {
        operator_delete((void *)local_b0);
      }
      uVar4 = parentName.field_2._8_8_;
      if (this->m_verbose == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - replicator, id=",0x12);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)className.field_2._8_8_,
                            (long)id._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        poVar7 = std::ostream::_M_insert<double>((double)r.count.stringValue.field_2._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"x \'",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)v._56_8_,(long)className._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' under parent=",0xf);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)r.terminator.field_2._8_8_,
                            (long)parentName._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      bVar8 = true;
      std::vector<Replicator,_std::allocator<Replicator>_>::push_back
                ((vector<Replicator,_std::allocator<Replicator>_> *)(uVar4 + 0xc0),
                 (value_type *)local_1b8);
    }
    else {
      _Var2 = cVar6._M_node[2]._M_color;
      if (_Var2 == 2) {
        v.stringValue.field_2._8_8_ = cVar6._M_node[2]._M_parent;
        v.stringValue._M_dataplus._M_p = (pointer)0x0;
        v.stringValue._M_string_length._0_1_ = 0;
        v.numberValue = 0.0;
        v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
        local_b0 = (undefined1  [8])psVar1;
        std::__cxx11::string::operator=(this_00,(string *)local_b0);
        peVar5 = v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        r.count.numberValue = v.numberValue;
        peVar3 = r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        r.count.stringValue.field_2._8_8_ = v.stringValue.field_2._8_8_;
        v.numberValue = 0.0;
        v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5
        ;
        if (peVar3 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3);
        }
        r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._0_4_ = v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_;
        if (v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     v.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if (local_b0 != (undefined1  [8])psVar1) {
          operator_delete((void *)local_b0);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"error: malformed value for replicator id=",0x29);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)className.field_2._8_8_,
                            (long)id._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", in class=",0xb);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(char *)v._56_8_,(long)className._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      if (_Var2 == 2) goto LAB_0010f499;
      bVar8 = false;
    }
    if ((size_type *)r.initializor.field_2._8_8_ != &r.terminator._M_string_length) {
      operator_delete((void *)r.initializor.field_2._8_8_);
    }
    if ((size_type *)r.count._56_8_ != &r.initializor._M_string_length) {
      operator_delete((void *)r.count._56_8_);
    }
    if (r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 r.count.bindingValue.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
    }
    if ((size_type *)r.parentId.field_2._8_8_ != &r.count.stringValue._M_string_length) {
      operator_delete((void *)r.parentId.field_2._8_8_);
    }
    if ((size_type *)r.clazz.field_2._8_8_ != &r.parentId._M_string_length) {
      operator_delete((void *)r.clazz.field_2._8_8_);
    }
    if ((size_type *)r.id.field_2._8_8_ != &r.clazz._M_string_length) {
      operator_delete((void *)r.id.field_2._8_8_);
    }
    if (local_1b8 != (undefined1  [8])&r.id._M_string_length) {
      operator_delete((void *)local_1b8);
    }
  }
  if ((size_type *)r.terminator.field_2._8_8_ != &parentName._M_string_length) {
    operator_delete((void *)r.terminator.field_2._8_8_);
  }
LAB_0010f6bf:
  if ((size_type *)v._56_8_ != &className._M_string_length) {
    operator_delete((void *)v._56_8_);
  }
  if ((size_type *)className.field_2._8_8_ != &id._M_string_length) {
    operator_delete((void *)className.field_2._8_8_);
  }
  return bVar8;
}

Assistant:

bool ObjectModelBuilder::buildReplicator(const picojson::object &object, Class *clazz)
{
    std::string id = uniqueIdentifier(clazz, findStringInObject(object, "id"));
    std::string className = findStringInObject(object, "class");
    if (className.empty()) {
        std::cerr << "error: 'replciator' missing 'class' tag, id=" << id << std::endl;
        return false;
    }
    std::string parentName = findStringInObject(object, "parent");
    if (parentName.empty()) {
        std::cerr << "error: 'replciator' missing 'parent' tag, id=" << id << std::endl;
        return false;
    }

    Replicator r;
    r.id = id;
    r.clazz = className;
    r.parentId = parentName;

    auto countIt = object.find("count");
    if (countIt != object.end()) {
        const picojson::value &countValue = countIt->second;
        if (countValue.is<double>()) {
            r.count = Value::number(countValue.get<double>());
        } else {
            std::cerr << "error: malformed value for replicator id=" << id << ", in class=" << className << std::endl;
            return false;
        }
    } else {
        r.count = Value::number(0);
    }

    r.initializor = findStringInObject(object, "initializor");
    r.terminator = findStringInObject(object, "terminator");

    if (m_verbose) {
        std::cerr << " - replicator, id=" << id << ": " << r.count.numberValue << "x '" << className << "' under parent=" << parentName << std::endl;
    }

    clazz->replicators.push_back(r);

    return true;
}